

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::CacheState::getFullBarrier
          (CacheState *this,VkPipelineStageFlags *srcStages,VkAccessFlags *srcAccesses,
          VkPipelineStageFlags *dstStages,VkAccessFlags *dstAccesses)

{
  VkPipelineStageFlagBits VVar1;
  PipelineStage PVar2;
  PipelineStage PVar3;
  VkPipelineStageFlagBits flags;
  VkPipelineStageFlagBits flags_00;
  
  *srcStages = 0;
  *srcAccesses = 0;
  *dstStages = 0;
  *dstAccesses = 0;
  VVar1 = this->m_allowedStages;
  if (VVar1 != 0) {
    flags_00 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;
    do {
      if ((VVar1 & flags_00) != 0) {
        PVar2 = pipelineStageFlagToPipelineStage(flags_00);
        if (this->m_incompleteOperations[PVar2] != 0) {
          *dstStages = *dstStages | flags_00;
          *srcStages = *srcStages | this->m_incompleteOperations[PVar2];
        }
        if (this->m_invisibleOperations[PVar2] != 0) {
          *dstStages = *dstStages | flags_00;
          *dstAccesses = *dstAccesses | this->m_invisibleOperations[PVar2];
        }
        VVar1 = this->m_allowedStages;
        if (VVar1 != 0) {
          flags = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;
          do {
            if ((VVar1 & flags) != 0) {
              PVar3 = pipelineStageFlagToPipelineStage(flags);
              if (this->m_unavailableWriteOperations[PVar2][PVar3] != 0) {
                *dstStages = *dstStages | flags_00;
                *srcStages = *srcStages | flags_00;
                *srcAccesses = *srcAccesses | this->m_unavailableWriteOperations[PVar2][PVar3];
              }
              if ((this->m_unavailableLayoutTransition[PVar2] == true) &&
                 (this->m_unavailableLayoutTransition[PVar3] == false)) {
                *dstStages = *dstStages | flags_00;
                *srcStages = *srcStages | flags_00;
              }
            }
            flags = flags * 2;
            VVar1 = this->m_allowedStages;
          } while (flags <= VVar1);
        }
      }
      flags_00 = flags_00 * 2;
      VVar1 = this->m_allowedStages;
    } while (flags_00 <= VVar1);
  }
  return;
}

Assistant:

void CacheState::getFullBarrier (vk::VkPipelineStageFlags&	srcStages,
								 vk::VkAccessFlags&			srcAccesses,
								 vk::VkPipelineStageFlags&	dstStages,
								 vk::VkAccessFlags&			dstAccesses) const
{
	srcStages	= 0;
	srcAccesses	= 0;
	dstStages	= 0;
	dstAccesses	= 0;

	for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= m_allowedStages; dstStage_ <<= 1)
	{
		const PipelineStage dstStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);

		if ((dstStage_ & m_allowedStages) == 0)
			continue;

		// Make sure all previous operation are complete in all stages
		if (m_incompleteOperations[dstStage])
		{
			dstStages |= dstStage_;
			srcStages |= m_incompleteOperations[dstStage];
		}

		// Make sure all read operations are visible in dstStage
		if (m_invisibleOperations[dstStage])
		{
			dstStages |= dstStage_;
			dstAccesses |= m_invisibleOperations[dstStage];
		}

		// Make sure all write operations fro mall stages are available
		for (vk::VkPipelineStageFlags srcStage_ = 1; srcStage_ <= m_allowedStages; srcStage_ <<= 1)
		{
			const PipelineStage srcStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)srcStage_);

			if ((srcStage_ & m_allowedStages) == 0)
				continue;

			if (m_unavailableWriteOperations[dstStage][srcStage])
			{
				dstStages |= dstStage_;
				srcStages |= dstStage_;
				srcAccesses |= m_unavailableWriteOperations[dstStage][srcStage];
			}

			if (m_unavailableLayoutTransition[dstStage] && !m_unavailableLayoutTransition[srcStage])
			{
				// Add dependency between srcStage and dstStage if layout transition has not completed in dstStage,
				// but has completed in srcStage.
				dstStages |= dstStage_;
				srcStages |= dstStage_;
			}
		}
	}

	DE_ASSERT((srcStages & (~m_allowedStages)) == 0);
	DE_ASSERT((srcAccesses & (~m_allowedAccesses)) == 0);
	DE_ASSERT((dstStages & (~m_allowedStages)) == 0);
	DE_ASSERT((dstAccesses & (~m_allowedAccesses)) == 0);
}